

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *this,int64_t id,TPZVec<long> *nodeindexes,
          int matind,TPZGeoMesh *mesh)

{
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>).super_TPZGeoEl =
       &PTR__TPZSavable_016b4730;
  TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>,&PTR_PTR_016b1ca8,id,nodeindexes,
             matind,mesh);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_016b19a8;
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  (this->fSubEl).fNAlloc = 0;
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(&this->fRefPattern);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(id,nodeindexes,matind,mesh) {
}